

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this,size_t MinSize)

{
  move_iterator<llvm::DWARFDebugLoc::LocationList_*> __first;
  void *pvVar1;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *__ptr;
  ulong uVar2;
  LocationList *__result;
  ulong uVar3;
  long lVar4;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar2 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar3 = uVar2 >> 1 | uVar2;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar2 = (uVar2 >> 0x20 | uVar3 >> 0x10 | uVar3) + 1;
  if (uVar2 <= MinSize) {
    uVar2 = MinSize;
  }
  if (0xfffffffe < uVar2) {
    uVar2 = 0xffffffff;
  }
  __result = (LocationList *)malloc(uVar2 * 0x68);
  if (__result == (LocationList *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  __first._M_current =
       (LocationList *)
       (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
       super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::LocationList*>,llvm::DWARFDebugLoc::LocationList*>
            (__first,__first._M_current +
                     (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>
                     ).super_SmallVectorBase.Size,__result);
  uVar3 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                 super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    pvVar1 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
             super_SmallVectorBase.BeginX;
    lVar4 = uVar3 * 0x68;
    do {
      SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
                ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)((long)pvVar1 + lVar4 + -0x60));
      lVar4 = lVar4 + -0x68;
    } while (lVar4 != 0);
  }
  __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)
          (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
  super_SmallVectorBase.BeginX = __result;
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
  super_SmallVectorBase.Capacity = (uint)uVar2;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}